

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O1

void point_add_mixed(pt_prj_t_conflict2 *R,pt_prj_t_conflict2 *Q,pt_aff_t_conflict2 *P)

{
  uint64_t *arg2;
  uint64_t *arg1;
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint64_t uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint64_t *arg2_00;
  ulong uVar21;
  ulong uVar22;
  byte local_318;
  uint64_t local_2b8;
  long lStack_2b0;
  long local_2a8;
  long lStack_2a0;
  long local_298;
  long lStack_290;
  long local_288;
  long lStack_280;
  long local_278;
  long lStack_270;
  uint64_t local_268;
  long lStack_260;
  long local_258;
  long lStack_250;
  long local_248;
  long lStack_240;
  long local_238;
  long lStack_230;
  long local_228;
  long lStack_220;
  uint64_t local_218;
  long lStack_210;
  long local_208;
  long lStack_200;
  long local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  long local_1d8;
  long lStack_1d0;
  uint64_t local_1c8;
  long lStack_1c0;
  long local_1b8;
  long lStack_1b0;
  long local_1a8;
  long lStack_1a0;
  long local_198;
  long lStack_190;
  long local_188;
  long lStack_180;
  uint64_t local_178;
  long lStack_170;
  long local_168;
  long lStack_160;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  long local_138;
  long lStack_130;
  uint64_t local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  uint64_t local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  uint64_t local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  arg2 = P->Y;
  uVar21 = 0;
  uVar22 = 0;
  lVar20 = 10;
  do {
    uVar21 = uVar21 | P->X[lVar20];
    uVar22 = uVar22 | (P->X + lVar20)[1];
    lVar20 = lVar20 + 2;
  } while (lVar20 != 0x14);
  local_318 = (byte)uVar22 | (byte)uVar21;
  arg2_00 = Q->Z;
  arg1 = Q->Y;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_2b8,Q->X,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_88,arg1,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_218,P->X,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_268,Q->X,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_268,&local_268);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_218,&local_218,&local_268);
  lVar19 = lStack_40;
  lVar18 = local_48;
  lVar17 = lStack_50;
  lVar16 = local_58;
  lVar15 = lStack_60;
  lVar14 = local_68;
  lVar13 = lStack_70;
  lVar12 = local_78;
  lVar11 = lStack_80;
  uVar10 = local_88;
  local_268 = local_2b8 + local_88;
  lStack_260 = lStack_2b0 + lStack_80;
  local_258 = local_2a8 + local_78;
  lStack_250 = lStack_2a0 + lStack_70;
  local_248 = local_298 + local_68;
  lStack_240 = lStack_290 + lStack_60;
  local_238 = local_288 + local_58;
  lStack_230 = lStack_280 + lStack_50;
  local_228 = local_278 + local_48;
  lStack_220 = lStack_270 + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_268,&local_268);
  local_218 = (local_218 - local_268) + 0x1ffffffffffb8e;
  lStack_210 = (lStack_210 - lStack_260) + 0xffffffffffffe;
  local_208 = (local_208 - local_258) + 0xffffffffffffe;
  lStack_200 = (lStack_200 - lStack_250) + 0xffffffffffffe;
  local_1f8 = (local_1f8 - local_248) + 0xffffffffffffe;
  lStack_1f0 = (lStack_1f0 - lStack_240) + 0x1ffffffffffffe;
  local_1e8 = (local_1e8 - local_238) + 0xffffffffffffe;
  lStack_1e0 = (lStack_1e0 - lStack_230) + 0xffffffffffffe;
  local_1d8 = (local_1d8 - local_228) + 0xffffffffffffe;
  lStack_1d0 = (lStack_1d0 - lStack_220) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_268,arg2,arg2_00);
  local_268 = Q->Y[0] + local_268;
  lStack_260 = Q->Y[1] + lStack_260;
  local_258 = Q->Y[2] + local_258;
  lStack_250 = Q->Y[3] + lStack_250;
  local_248 = Q->Y[4] + local_248;
  lStack_240 = Q->Y[5] + lStack_240;
  local_238 = Q->Y[6] + local_238;
  lStack_230 = Q->Y[7] + lStack_230;
  local_228 = Q->Y[8] + local_228;
  lStack_220 = Q->Y[9] + lStack_220;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_268,&local_268);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,P->X,arg2_00);
  local_128 = Q->X[0] + local_128;
  lStack_120 = Q->X[1] + lStack_120;
  local_118 = Q->X[2] + local_118;
  lStack_110 = Q->X[3] + lStack_110;
  local_108 = Q->X[4] + local_108;
  lStack_100 = Q->X[5] + lStack_100;
  local_f8 = Q->X[6] + local_f8;
  lStack_f0 = Q->X[7] + lStack_f0;
  local_e8 = Q->X[8] + local_e8;
  lStack_e0 = Q->X[9] + lStack_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_178,const_b,arg2_00);
  local_d8 = (local_128 - local_178) + 0x1ffffffffffb8e;
  lStack_d0 = (lStack_120 - lStack_170) + 0xffffffffffffe;
  local_c8 = (local_118 - local_168) + 0xffffffffffffe;
  lStack_c0 = (lStack_110 - lStack_160) + 0xffffffffffffe;
  local_b8 = (local_108 - local_158) + 0xffffffffffffe;
  lStack_b0 = (lStack_100 - lStack_150) + 0x1ffffffffffffe;
  local_a8 = (local_f8 - local_148) + 0xffffffffffffe;
  lStack_a0 = (lStack_f0 - lStack_140) + 0xffffffffffffe;
  local_98 = (local_e8 - local_138) + 0xffffffffffffe;
  lStack_90 = (lStack_e0 - lStack_130) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  lVar9 = lStack_90;
  lVar8 = local_98;
  lVar7 = lStack_a0;
  lVar6 = local_a8;
  lVar5 = lStack_b0;
  lVar4 = local_b8;
  lVar3 = lStack_c0;
  lVar2 = local_c8;
  lVar20 = lStack_d0;
  uVar1 = local_d8;
  local_178 = local_d8 * 2;
  lStack_170 = lStack_d0 * 2;
  local_168 = local_c8 * 2;
  lStack_160 = lStack_c0 * 2;
  local_158 = local_b8 * 2;
  lStack_150 = lStack_b0 * 2;
  local_148 = local_a8 * 2;
  lStack_140 = lStack_a0 * 2;
  local_138 = local_98 * 2;
  lStack_130 = lStack_90 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_178,&local_178);
  local_d8 = uVar1 + local_178;
  lStack_d0 = lVar20 + lStack_170;
  local_c8 = lVar2 + local_168;
  lStack_c0 = lVar3 + lStack_160;
  local_b8 = lVar4 + local_158;
  lStack_b0 = lVar5 + lStack_150;
  local_a8 = lVar6 + local_148;
  lStack_a0 = lVar7 + lStack_140;
  local_98 = lVar8 + local_138;
  lStack_90 = lVar9 + lStack_130;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  lVar9 = lStack_90;
  lVar8 = local_98;
  lVar7 = lStack_a0;
  lVar6 = local_a8;
  lVar5 = lStack_b0;
  lVar4 = local_b8;
  lVar3 = lStack_c0;
  lVar2 = local_c8;
  lVar20 = lStack_d0;
  uVar1 = local_d8;
  local_178 = (uVar10 - local_d8) + 0x1ffffffffffb8e;
  lStack_170 = (lVar11 - lStack_d0) + 0xffffffffffffe;
  local_168 = (lVar12 - local_c8) + 0xffffffffffffe;
  lStack_160 = (lVar13 - lStack_c0) + 0xffffffffffffe;
  local_158 = (lVar14 - local_b8) + 0xffffffffffffe;
  lStack_150 = (lVar15 - lStack_b0) + 0x1ffffffffffffe;
  local_148 = (lVar16 - local_a8) + 0xffffffffffffe;
  lStack_140 = (lVar17 - lStack_a0) + 0xffffffffffffe;
  local_138 = (lVar18 - local_98) + 0xffffffffffffe;
  lStack_130 = (lVar19 - lStack_90) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_178,&local_178);
  local_d8 = uVar1 + uVar10;
  lStack_d0 = lVar20 + lVar11;
  local_c8 = lVar2 + lVar12;
  lStack_c0 = lVar3 + lVar13;
  local_b8 = lVar4 + lVar14;
  lStack_b0 = lVar5 + lVar15;
  local_a8 = lVar6 + lVar16;
  lStack_a0 = lVar7 + lVar17;
  local_98 = lVar8 + lVar18;
  lStack_90 = lVar9 + lVar19;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,const_b,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_88,arg2_00,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  local_1c8 = Q->Z[0] + local_88;
  lStack_1c0 = Q->Z[1] + lStack_80;
  local_1b8 = Q->Z[2] + local_78;
  lStack_1b0 = Q->Z[3] + lStack_70;
  local_1a8 = Q->Z[4] + local_68;
  lStack_1a0 = Q->Z[5] + lStack_60;
  local_198 = Q->Z[6] + local_58;
  lStack_190 = Q->Z[7] + lStack_50;
  local_188 = Q->Z[8] + local_48;
  lStack_180 = Q->Z[9] + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_1c8,&local_1c8);
  lVar9 = lStack_180;
  lVar8 = local_188;
  lVar7 = lStack_190;
  lVar6 = local_198;
  lVar5 = lStack_1a0;
  lVar4 = local_1a8;
  lVar3 = lStack_1b0;
  lVar2 = local_1b8;
  lVar20 = lStack_1c0;
  uVar1 = local_1c8;
  local_128 = (local_128 - local_1c8) + 0x1ffffffffffb8e;
  lStack_120 = (lStack_120 - lStack_1c0) + 0xffffffffffffe;
  local_118 = (local_118 - local_1b8) + 0xffffffffffffe;
  lStack_110 = (lStack_110 - lStack_1b0) + 0xffffffffffffe;
  local_108 = (local_108 - local_1a8) + 0xffffffffffffe;
  lStack_100 = (lStack_100 - lStack_1a0) + 0x1ffffffffffffe;
  local_f8 = (local_f8 - local_198) + 0xffffffffffffe;
  lStack_f0 = (lStack_f0 - lStack_190) + 0xffffffffffffe;
  local_e8 = (local_e8 - local_188) + 0xffffffffffffe;
  lStack_e0 = (lStack_e0 - lStack_180) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  local_128 = (local_128 - local_2b8) + 0x1ffffffffffb8e;
  lStack_120 = (lStack_120 - lStack_2b0) + 0xffffffffffffe;
  local_118 = (local_118 - local_2a8) + 0xffffffffffffe;
  lStack_110 = (lStack_110 - lStack_2a0) + 0xffffffffffffe;
  local_108 = (local_108 - local_298) + 0xffffffffffffe;
  lStack_100 = (lStack_100 - lStack_290) + 0x1ffffffffffffe;
  local_f8 = (local_f8 - local_288) + 0xffffffffffffe;
  lStack_f0 = (lStack_f0 - lStack_280) + 0xffffffffffffe;
  local_e8 = (local_e8 - local_278) + 0xffffffffffffe;
  lStack_e0 = (lStack_e0 - lStack_270) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  lVar19 = lStack_e0;
  lVar18 = local_e8;
  lVar17 = lStack_f0;
  lVar16 = local_f8;
  lVar15 = lStack_100;
  lVar14 = local_108;
  lVar13 = lStack_110;
  lVar12 = local_118;
  lVar11 = lStack_120;
  uVar10 = local_128;
  local_88 = local_128 * 2;
  lStack_80 = lStack_120 * 2;
  local_78 = local_118 * 2;
  lStack_70 = lStack_110 * 2;
  local_68 = local_108 * 2;
  lStack_60 = lStack_100 * 2;
  local_58 = local_f8 * 2;
  lStack_50 = lStack_f0 * 2;
  local_48 = local_e8 * 2;
  lStack_40 = lStack_e0 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  local_128 = uVar10 + local_88;
  lStack_120 = lVar11 + lStack_80;
  local_118 = lVar12 + local_78;
  lStack_110 = lVar13 + lStack_70;
  local_108 = lVar14 + local_68;
  lStack_100 = lVar15 + lStack_60;
  local_f8 = lVar16 + local_58;
  lStack_f0 = lVar17 + lStack_50;
  local_e8 = lVar18 + local_48;
  lStack_e0 = lVar19 + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  local_88 = local_2b8 * 2;
  lStack_80 = lStack_2b0 * 2;
  local_78 = local_2a8 * 2;
  lStack_70 = lStack_2a0 * 2;
  local_68 = local_298 * 2;
  lStack_60 = lStack_290 * 2;
  local_58 = local_288 * 2;
  lStack_50 = lStack_280 * 2;
  local_48 = local_278 * 2;
  lStack_40 = lStack_270 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  local_2b8 = local_2b8 + local_88;
  lStack_2b0 = lStack_2b0 + lStack_80;
  local_2a8 = local_2a8 + local_78;
  lStack_2a0 = lStack_2a0 + lStack_70;
  local_298 = local_298 + local_68;
  lStack_290 = lStack_290 + lStack_60;
  local_288 = local_288 + local_58;
  lStack_280 = lStack_280 + lStack_50;
  local_278 = local_278 + local_48;
  lStack_270 = lStack_270 + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_2b8,&local_2b8);
  local_2b8 = (local_2b8 - uVar1) + 0x1ffffffffffb8e;
  lStack_2b0 = (lStack_2b0 - lVar20) + 0xffffffffffffe;
  local_2a8 = (local_2a8 - lVar2) + 0xffffffffffffe;
  lStack_2a0 = (lStack_2a0 - lVar3) + 0xffffffffffffe;
  local_298 = (local_298 - lVar4) + 0xffffffffffffe;
  lStack_290 = (lStack_290 - lVar5) + 0x1ffffffffffffe;
  local_288 = (local_288 - lVar6) + 0xffffffffffffe;
  lStack_280 = (lStack_280 - lVar7) + 0xffffffffffffe;
  local_278 = (local_278 - lVar8) + 0xffffffffffffe;
  lStack_270 = (lStack_270 - lVar9) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_2b8,&local_2b8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_88,&local_268,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_1c8,&local_2b8,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,&local_d8,&local_178);
  local_128 = local_1c8 + local_128;
  lStack_120 = lStack_1c0 + lStack_120;
  local_118 = local_1b8 + local_118;
  lStack_110 = lStack_1b0 + lStack_110;
  local_108 = local_1a8 + local_108;
  lStack_100 = lStack_1a0 + lStack_100;
  local_f8 = local_198 + local_f8;
  lStack_f0 = lStack_190 + lStack_f0;
  local_e8 = local_188 + local_e8;
  lStack_e0 = lStack_180 + lStack_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_d8,&local_218,&local_d8);
  local_d8 = (local_d8 - local_88) + 0x1ffffffffffb8e;
  lStack_d0 = (lStack_d0 - lStack_80) + 0xffffffffffffe;
  local_c8 = (local_c8 - local_78) + 0xffffffffffffe;
  lStack_c0 = (lStack_c0 - lStack_70) + 0xffffffffffffe;
  local_b8 = (local_b8 - local_68) + 0xffffffffffffe;
  lStack_b0 = (lStack_b0 - lStack_60) + 0x1ffffffffffffe;
  local_a8 = (local_a8 - local_58) + 0xffffffffffffe;
  lStack_a0 = (lStack_a0 - lStack_50) + 0xffffffffffffe;
  local_98 = (local_98 - local_48) + 0xffffffffffffe;
  lStack_90 = (lStack_90 - lStack_40) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_178,&local_268,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_88,&local_218,&local_2b8);
  local_178 = local_88 + local_178;
  lStack_170 = lStack_80 + lStack_170;
  local_168 = local_78 + local_168;
  lStack_160 = lStack_70 + lStack_160;
  local_158 = local_68 + local_158;
  lStack_150 = lStack_60 + lStack_150;
  local_148 = local_58 + local_148;
  lStack_140 = lStack_50 + lStack_140;
  local_138 = local_48 + local_138;
  lStack_130 = lStack_40 + lStack_130;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_178,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->X,local_318,Q->X,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->Y,local_318,arg1,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->Z,local_318,arg2_00,&local_178);
  return;
}

Assistant:

static void point_add_mixed(pt_prj_t *R, const pt_prj_t *Q, const pt_aff_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    fe_t X3;
    fe_t Y3;
    fe_t Z3;
    limb_t nz;

    /* check P for affine inf */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_nonzero(&nz, P->Y);

    /* the curve arith formula */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t0, X1, X2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, Y1, Y2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, X2, Y2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, X1, Y1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, t0, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t4, Y2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, t4, Y1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, X2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, Y3, X1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, b, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, Y3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, X3, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(X3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Z3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(X3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, b, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, Z1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t2, t1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Y3, Y3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, Y3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, t0, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t0, t1, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(t0, t0, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, t4, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t2, t0, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(X3, t3, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, X3, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, t4, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, t3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, t1);

    /* if P is inf, throw all that away and take Q */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->X, nz, Q->X, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->Y, nz, Q->Y, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->Z, nz, Q->Z, Z3);
}